

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O1

void pzgeom::TPZGeoBlend<pzgeom::TPZGeoCube>::InsertExampleElement
               (TPZGeoMesh *gmesh,int matid,TPZVec<double> *lowercorner,TPZVec<double> *size)

{
  TPZGeoEl *pTVar1;
  TPZGeoEl **ppTVar2;
  long lVar3;
  TPZGeoElRefPattern<pzgeom::TPZWavyLine> *this;
  int i;
  ulong uVar4;
  int64_t index;
  TPZManVector<long,_3> nodeindexes;
  TPZManVector<double,_3> wavedir;
  double local_98;
  TPZManVector<long,_3> local_90;
  TPZManVector<double,_3> local_58;
  
  TPZGeoCube::InsertExampleElement(gmesh,-1,lowercorner,size);
  lVar3 = (gmesh->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements;
  TPZManVector<long,_3>::TPZManVector(&local_90,8);
  ppTVar2 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                      (&(gmesh->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>,lVar3 + -1);
  pTVar1 = *ppTVar2;
  uVar4 = 0;
  do {
    lVar3 = (**(code **)(*(long *)pTVar1 + 0xa8))(pTVar1,uVar4 & 0xffffffff);
    local_90.super_TPZVec<long>.fStore[uVar4] = lVar3;
    uVar4 = uVar4 + 1;
  } while (uVar4 != 8);
  this = (TPZGeoElRefPattern<pzgeom::TPZWavyLine> *)operator_new(0x108);
  TPZGeoElRefPattern<pzgeom::TPZWavyLine>::TPZGeoElRefPattern
            (this,&local_90.super_TPZVec<long>,matid,gmesh);
  local_98 = 0.02;
  TPZManVector<double,_3>::TPZManVector(&local_58,3,&local_98);
  *local_58.super_TPZVec<double>.fStore = 0.0;
  TPZWavyLine::SetData
            (&(this->super_TPZGeoElRefLess<pzgeom::TPZWavyLine>).fGeo,&local_58.super_TPZVec<double>
             ,2);
  (**(code **)(*(long *)pTVar1 + 8))(pTVar1);
  (*(gmesh->super_TPZSavable)._vptr_TPZSavable[0xd])(gmesh,7,&local_90,matid,&local_98);
  TPZManVector<double,_3>::~TPZManVector(&local_58);
  if (local_90.super_TPZVec<long>.fStore == local_90.fExtAlloc) {
    local_90.super_TPZVec<long>.fStore = (long *)0x0;
  }
  local_90.super_TPZVec<long>.fNAlloc = 0;
  local_90.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  if (local_90.super_TPZVec<long>.fStore != (long *)0x0) {
    operator_delete__(local_90.super_TPZVec<long>.fStore);
  }
  return;
}

Assistant:

void pzgeom::TPZGeoBlend<TGeo>::InsertExampleElement(TPZGeoMesh &gmesh, int matid, TPZVec<REAL> &lowercorner, TPZVec<REAL> &size)
{
    
    TGeo::InsertExampleElement(gmesh, -1, lowercorner, size);
    int64_t elid = gmesh.ElementVec().NElements()-1;
    TPZManVector<int64_t,3> nodeindexes(8);
    TPZGeoEl *gel = gmesh.Element(elid);
    int NNodes = TGeo::NCornerNodes;
    for (int i=0; i<NNodes; i++) {
        nodeindexes[i] = gel->NodeIndex(i);
    }
    TPZGeoElRefPattern<TPZWavyLine> *gelwave = new TPZGeoElRefPattern<TPZWavyLine>(nodeindexes,matid,gmesh);
    TPZManVector<REAL,3> wavedir(3,0.02);
    wavedir[0] = 0.;
    gelwave->Geom().SetData(wavedir, 2);
    delete gel;
    int64_t index;
    gmesh.CreateGeoBlendElement(TGeo::Type(), nodeindexes, matid, index);
}